

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

shared_ptr<wasm::GCData> __thiscall wasm::Literal::getGCData(Literal *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Literal *in_RSI;
  shared_ptr<wasm::GCData> sVar2;
  bool local_19;
  Literal *this_local;
  
  bVar1 = isNull(in_RSI);
  local_19 = true;
  if (!bVar1) {
    local_19 = isData(in_RSI);
  }
  if (local_19 == false) {
    __assert_fail("isNull() || isData()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x149,"std::shared_ptr<GCData> wasm::Literal::getGCData() const");
  }
  std::shared_ptr<wasm::GCData>::shared_ptr
            ((shared_ptr<wasm::GCData> *)this,(shared_ptr<wasm::GCData> *)in_RSI);
  sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<wasm::GCData>)
         sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GCData> Literal::getGCData() const {
  assert(isNull() || isData());
  return gcData;
}